

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walIndexAppend(Wal *pWal,u32 iFrame,u32 iPage)

{
  u32 uVar1;
  u32 *puVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  u32 iZero;
  ht_slot *aHash;
  u32 *aPgno;
  u32 local_44;
  ht_slot *local_40;
  u32 *local_38;
  
  local_44 = 0;
  local_38 = (u32 *)0x0;
  local_40 = (ht_slot *)0x0;
  iVar3 = walHashGet(pWal,(int)((ulong)(iFrame + 0x1000) + 0xffffffff021 >> 0xc),&local_40,&local_38
                     ,&local_44);
  puVar2 = local_38;
  uVar1 = local_44;
  if (iVar3 == 0) {
    iVar3 = iFrame - local_44;
    if (iVar3 == 1) {
      memset(local_38 + 1,0,(long)(((int)local_40 - (int)(local_38 + 1)) + 0x4000));
    }
    if (puVar2[iVar3] != 0) {
      walCleanupHash(pWal);
    }
    uVar4 = iPage * 0x17f;
    iVar5 = uVar1 - iFrame;
    while( true ) {
      uVar4 = uVar4 & 0x1fff;
      if (local_40[uVar4] == 0) break;
      if (iVar5 == 0) {
        iVar3 = sqlite3CorruptError(0xd82c);
        return iVar3;
      }
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + 1;
    }
    puVar2[iVar3] = iPage;
    local_40[uVar4] = (ht_slot)iVar3;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int walIndexAppend(Wal *pWal, u32 iFrame, u32 iPage){
  int rc;                         /* Return code */
  u32 iZero = 0;                  /* One less than frame number of aPgno[1] */
  volatile u32 *aPgno = 0;        /* Page number array */
  volatile ht_slot *aHash = 0;    /* Hash table */

  rc = walHashGet(pWal, walFramePage(iFrame), &aHash, &aPgno, &iZero);

  /* Assuming the wal-index file was successfully mapped, populate the
  ** page number array and hash table entry.
  */
  if( rc==SQLITE_OK ){
    int iKey;                     /* Hash table key */
    int idx;                      /* Value to write to hash-table slot */
    int nCollide;                 /* Number of hash collisions */

    idx = iFrame - iZero;
    assert( idx <= HASHTABLE_NSLOT/2 + 1 );
    
    /* If this is the first entry to be added to this hash-table, zero the
    ** entire hash table and aPgno[] array before proceeding. 
    */
    if( idx==1 ){
      int nByte = (int)((u8 *)&aHash[HASHTABLE_NSLOT] - (u8 *)&aPgno[1]);
      memset((void*)&aPgno[1], 0, nByte);
    }

    /* If the entry in aPgno[] is already set, then the previous writer
    ** must have exited unexpectedly in the middle of a transaction (after
    ** writing one or more dirty pages to the WAL to free up memory). 
    ** Remove the remnants of that writers uncommitted transaction from 
    ** the hash-table before writing any new entries.
    */
    if( aPgno[idx] ){
      walCleanupHash(pWal);
      assert( !aPgno[idx] );
    }

    /* Write the aPgno[] array entry and the hash-table slot. */
    nCollide = idx;
    for(iKey=walHash(iPage); aHash[iKey]; iKey=walNextHash(iKey)){
      if( (nCollide--)==0 ) return SQLITE_CORRUPT_BKPT;
    }
    aPgno[idx] = iPage;
    aHash[iKey] = (ht_slot)idx;

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
    /* Verify that the number of entries in the hash table exactly equals
    ** the number of entries in the mapping region.
    */
    {
      int i;           /* Loop counter */
      int nEntry = 0;  /* Number of entries in the hash table */
      for(i=0; i<HASHTABLE_NSLOT; i++){ if( aHash[i] ) nEntry++; }
      assert( nEntry==idx );
    }

    /* Verify that the every entry in the mapping region is reachable
    ** via the hash table.  This turns out to be a really, really expensive
    ** thing to check, so only do this occasionally - not on every
    ** iteration.
    */
    if( (idx&0x3ff)==0 ){
      int i;           /* Loop counter */
      for(i=1; i<=idx; i++){
        for(iKey=walHash(aPgno[i]); aHash[iKey]; iKey=walNextHash(iKey)){
          if( aHash[iKey]==i ) break;
        }
        assert( aHash[iKey]==i );
      }
    }
#endif /* SQLITE_ENABLE_EXPENSIVE_ASSERT */
  }


  return rc;
}